

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intensity_aperture_solver.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  char cVar2;
  char cVar3;
  int iVar4;
  Station *this;
  EvaluationFunction *ev;
  int iVar5;
  long lVar6;
  ulong uVar7;
  int i;
  double dVar8;
  initializer_list<args::EitherFlag> in;
  initializer_list<args::EitherFlag> in_00;
  initializer_list<args::EitherFlag> in_01;
  initializer_list<args::EitherFlag> in_02;
  initializer_list<args::EitherFlag> in_03;
  initializer_list<args::EitherFlag> in_04;
  initializer_list<args::EitherFlag> in_05;
  initializer_list<args::EitherFlag> in_06;
  initializer_list<args::EitherFlag> in_07;
  initializer_list<args::EitherFlag> in_08;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  initializer_list<double> __l_01;
  int local_e44;
  int local_e40;
  int local_e3c;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  coord_files;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  organ_files;
  double local_df8;
  double local_de0;
  double local_dd8;
  double local_dd0;
  vector<imrt::Volume,_std::allocator<imrt::Volume>_> volumes;
  IntensityILS ils;
  vector<imrt::Station_*,_std::allocator<imrt::Station_*>_> stations;
  vector<double,_std::allocator<double>_> w;
  ValueFlag<double,_args::ValueReader<double>_> _alpha;
  Plan P;
  ValueFlag<double,_args::ValueReader<double>_> _beta;
  _Vector_base<double,_std::allocator<double>_> local_a88;
  _Vector_base<double,_std::allocator<double>_> local_a70;
  _Vector_base<double,_std::allocator<double>_> local_a58;
  vector<double,_std::allocator<double>_> Zmax;
  vector<double,_std::allocator<double>_> Zmin;
  Collimator collimator;
  ValueFlag<int,_args::ValueReader<int>_> _maxiter;
  ValueFlag<int,_args::ValueReader<int>_> _maxratio;
  ValueFlag<int,_args::ValueReader<int>_> _maxdelta;
  ValueFlag<int,_args::ValueReader<int>_> _max_apertures;
  ValueFlag<int,_args::ValueReader<int>_> _int0;
  string local_448;
  ValueFlag<int,_args::ValueReader<int>_> _vsize;
  ValueFlag<int,_args::ValueReader<int>_> _bsize;
  ArgumentParser parser;
  HelpFlag help;
  
  std::__cxx11::string::string
            ((string *)&collimator,"********* IMRT-Solver (Intensity-aperture solver) *********",
             (allocator *)&_beta);
  std::__cxx11::string::string
            ((string *)&_alpha,
             "Example:\n./IAS --max_iter=400 --maxdelta=8 --maxratio=6 --alpha=0.999 --beta=0.999 --max_ap=4"
             ,(allocator *)&_bsize);
  args::ArgumentParser::ArgumentParser(&parser,(string *)&collimator,(string *)&_alpha);
  std::__cxx11::string::~string((string *)&_alpha);
  std::__cxx11::string::~string((string *)&collimator);
  std::__cxx11::string::string((string *)&_beta,"help",(allocator *)&_vsize);
  std::__cxx11::string::string((string *)&_bsize,"Display this help menu",(allocator *)&_int0);
  _alpha.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._8_8_ =
       &_alpha.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help._M_string_length;
  _alpha.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base._0_2_ = 0x6801;
  _alpha.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help._M_dataplus._M_p =
       (pointer)0x0;
  _alpha.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help._M_string_length._0_1_ =
       0;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)
             ((long)&_alpha.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help.
                     field_2 + 8),"help");
  in._M_len = 2;
  in._M_array = (iterator)&_alpha;
  args::Matcher::Matcher((Matcher *)&collimator,in);
  args::HelpFlag::HelpFlag
            (&help,&parser.super_Group,(string *)&_beta,(string *)&_bsize,(Matcher *)&collimator);
  args::Matcher::~Matcher((Matcher *)&collimator);
  lVar6 = 0x30;
  do {
    std::__cxx11::string::~string
              ((string *)
               ((long)&_alpha.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                       _vptr_Base + lVar6));
    lVar6 = lVar6 + -0x28;
  } while (lVar6 != -0x20);
  std::__cxx11::string::~string((string *)&_bsize);
  std::__cxx11::string::~string((string *)&_beta);
  std::__cxx11::string::string((string *)&_beta,"int",(allocator *)&_maxratio);
  std::__cxx11::to_string((string *)&_max_apertures,5);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_int0,
                 "Number of considered beamlets for selection (",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &_max_apertures);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_vsize,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_int0,")");
  args::EitherFlag::EitherFlag((EitherFlag *)&_alpha,"bsize");
  in_00._M_len = 1;
  in_00._M_array = (iterator)&_alpha;
  args::Matcher::Matcher((Matcher *)&collimator,in_00);
  _maxdelta.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base._0_4_ = 0;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&_bsize,&parser.super_Group,(string *)&_beta,(string *)&_vsize,(Matcher *)&collimator,
             (int *)&_maxdelta,false);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string
            ((string *)&_alpha.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.matched
            );
  std::__cxx11::string::~string((string *)&_vsize);
  std::__cxx11::string::~string((string *)&_int0);
  std::__cxx11::string::~string((string *)&_max_apertures);
  std::__cxx11::string::~string((string *)&_beta);
  std::__cxx11::string::string((string *)&_beta,"int",(allocator *)&_maxiter);
  local_e40 = 0x14;
  std::__cxx11::to_string((string *)&_maxdelta,0x14);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &_max_apertures,"Number of considered worst voxels (",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_maxdelta);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_int0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &_max_apertures,")");
  args::EitherFlag::EitherFlag((EitherFlag *)&_alpha,"vsize");
  in_01._M_len = 1;
  in_01._M_array = (iterator)&_alpha;
  args::Matcher::Matcher((Matcher *)&collimator,in_01);
  _maxratio.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base._0_4_ = 0;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&_vsize,&parser.super_Group,(string *)&_beta,(string *)&_int0,(Matcher *)&collimator,
             (int *)&_maxratio,false);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string
            ((string *)&_alpha.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.matched
            );
  std::__cxx11::string::~string((string *)&_int0);
  std::__cxx11::string::~string((string *)&_max_apertures);
  std::__cxx11::string::~string((string *)&_maxdelta);
  std::__cxx11::string::~string((string *)&_beta);
  std::__cxx11::string::string((string *)&_beta,"int",(allocator *)&P);
  local_dd0 = 4.0;
  std::__cxx11::to_string((string *)&_maxratio,4.0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_maxdelta,
                 "Initial intensity for beams  (",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_maxratio);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &_max_apertures,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_maxdelta,")"
                );
  args::EitherFlag::EitherFlag((EitherFlag *)&_alpha,"int0");
  in_02._M_len = 1;
  in_02._M_array = (iterator)&_alpha;
  args::Matcher::Matcher((Matcher *)&collimator,in_02);
  _maxiter.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base._0_4_ = 0;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&_int0,&parser.super_Group,(string *)&_beta,(string *)&_max_apertures,
             (Matcher *)&collimator,(int *)&_maxiter,false);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string
            ((string *)&_alpha.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.matched
            );
  std::__cxx11::string::~string((string *)&_max_apertures);
  std::__cxx11::string::~string((string *)&_maxdelta);
  std::__cxx11::string::~string((string *)&_maxratio);
  std::__cxx11::string::~string((string *)&_beta);
  std::__cxx11::string::string((string *)&_beta,"int",(allocator *)&ils);
  local_e3c = 4;
  std::__cxx11::to_string((string *)&_maxiter,4);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_maxratio,
                 "Initial intensity for the station  (",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_maxiter);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_maxdelta,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_maxratio,")"
                );
  args::EitherFlag::EitherFlag((EitherFlag *)&_alpha,"max_ap");
  in_03._M_len = 1;
  in_03._M_array = (iterator)&_alpha;
  args::Matcher::Matcher((Matcher *)&collimator,in_03);
  P._vptr_Plan = (_func_int **)((ulong)P._vptr_Plan._4_4_ << 0x20);
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&_max_apertures,&parser.super_Group,(string *)&_beta,(string *)&_maxdelta,
             (Matcher *)&collimator,(int *)&P,false);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string
            ((string *)&_alpha.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.matched
            );
  std::__cxx11::string::~string((string *)&_maxdelta);
  std::__cxx11::string::~string((string *)&_maxratio);
  std::__cxx11::string::~string((string *)&_maxiter);
  std::__cxx11::string::~string((string *)&_beta);
  std::__cxx11::string::string((string *)&_beta,"int",(allocator *)&coord_files);
  std::__cxx11::to_string((string *)&P,5.0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_maxiter,
                 "Max delta  (",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&P);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_maxratio,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_maxiter,")")
  ;
  args::EitherFlag::EitherFlag((EitherFlag *)&_alpha,"maxdelta");
  in_04._M_len = 1;
  in_04._M_array = (iterator)&_alpha;
  args::Matcher::Matcher((Matcher *)&collimator,in_04);
  ils.super_ILS._vptr_ILS = (_func_int **)((ulong)ils.super_ILS._vptr_ILS._4_4_ << 0x20);
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&_maxdelta,&parser.super_Group,(string *)&_beta,(string *)&_maxratio,
             (Matcher *)&collimator,(int *)&ils,false);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string
            ((string *)&_alpha.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.matched
            );
  std::__cxx11::string::~string((string *)&_maxratio);
  std::__cxx11::string::~string((string *)&_maxiter);
  std::__cxx11::string::~string((string *)&P);
  std::__cxx11::string::~string((string *)&_beta);
  std::__cxx11::string::string((string *)&_beta,"int",(allocator *)&organ_files);
  std::__cxx11::to_string((string *)&ils,3.0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&P,
                 "Max ratio  (",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ils);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_maxiter,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&P,")");
  args::EitherFlag::EitherFlag((EitherFlag *)&_alpha,"maxratio");
  in_05._M_len = 1;
  in_05._M_array = (iterator)&_alpha;
  args::Matcher::Matcher((Matcher *)&collimator,in_05);
  coord_files.
  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&_maxratio,&parser.super_Group,(string *)&_beta,(string *)&_maxiter,
             (Matcher *)&collimator,(int *)&coord_files,false);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string
            ((string *)&_alpha.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.matched
            );
  std::__cxx11::string::~string((string *)&_maxiter);
  std::__cxx11::string::~string((string *)&P);
  std::__cxx11::string::~string((string *)&ils);
  std::__cxx11::string::~string((string *)&_beta);
  std::__cxx11::string::string((string *)&_maxiter,"double",(allocator *)&volumes);
  std::__cxx11::to_string((string *)&coord_files,1.0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ils,
                 "Initial temperature for intensities  (",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&coord_files);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&P,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ils,")");
  args::EitherFlag::EitherFlag((EitherFlag *)&_beta,"alpha");
  in_06._M_len = 1;
  in_06._M_array = (iterator)&_beta;
  args::Matcher::Matcher((Matcher *)&collimator,in_06);
  organ_files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  args::ValueFlag<double,_args::ValueReader<double>_>::ValueFlag
            (&_alpha,&parser.super_Group,(string *)&_maxiter,(string *)&P,(Matcher *)&collimator,
             (double *)&organ_files,false);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string
            ((string *)&_beta.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.matched)
  ;
  std::__cxx11::string::~string((string *)&P);
  std::__cxx11::string::~string((string *)&ils);
  std::__cxx11::string::~string((string *)&coord_files);
  std::__cxx11::string::~string((string *)&_maxiter);
  std::__cxx11::string::string((string *)&P,"double",(allocator *)&stations);
  local_dd8 = 1.0;
  std::__cxx11::to_string((string *)&organ_files,1.0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&coord_files,
                 "Initial temperature for ratio  (",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&organ_files);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ils,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&coord_files,
                 ")");
  args::EitherFlag::EitherFlag((EitherFlag *)&_maxiter,"beta");
  in_07._M_len = 1;
  in_07._M_array = (iterator)&_maxiter;
  args::Matcher::Matcher((Matcher *)&collimator,in_07);
  volumes.super__Vector_base<imrt::Volume,_std::allocator<imrt::Volume>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  args::ValueFlag<double,_args::ValueReader<double>_>::ValueFlag
            (&_beta,&parser.super_Group,(string *)&P,(string *)&ils,(Matcher *)&collimator,
             (double *)&volumes,false);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string
            ((string *)
             &_maxiter.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.matched);
  std::__cxx11::string::~string((string *)&ils);
  std::__cxx11::string::~string((string *)&coord_files);
  std::__cxx11::string::~string((string *)&organ_files);
  std::__cxx11::string::~string((string *)&P);
  std::__cxx11::string::string((string *)&ils,"int",(allocator *)&w);
  local_e44 = 100;
  std::__cxx11::to_string((string *)&volumes,100);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&organ_files,
                 "Number of iterations (",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&volumes);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&coord_files,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&organ_files,
                 ")");
  args::EitherFlag::EitherFlag((EitherFlag *)&P,"max_iter");
  in_08._M_len = 1;
  in_08._M_array = (iterator)&P;
  args::Matcher::Matcher((Matcher *)&collimator,in_08);
  stations.super__Vector_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&_maxiter,&parser.super_Group,(string *)&ils,(string *)&coord_files,
             (Matcher *)&collimator,(int *)&stations,false);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string((string *)&P.angle2station);
  std::__cxx11::string::~string((string *)&coord_files);
  std::__cxx11::string::~string((string *)&organ_files);
  std::__cxx11::string::~string((string *)&volumes);
  std::__cxx11::string::~string((string *)&ils);
  args::ArgumentParser::ParseCLI(&parser,argc,argv);
  iVar4 = (*_bsize.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])();
  iVar5 = 5;
  if ((char)iVar4 != '\0') {
    iVar5 = _bsize.value;
  }
  iVar4 = (*_vsize.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])();
  if ((char)iVar4 != '\0') {
    local_e40 = _vsize.value;
  }
  cVar1 = (**(code **)(CONCAT44(_maxdelta.super_ValueFlagBase.super_FlagBase.super_NamedBase.
                                super_Base._vptr_Base._4_4_,
                                _maxdelta.super_ValueFlagBase.super_FlagBase.super_NamedBase.
                                super_Base._vptr_Base._0_4_) + 0x10))(&_maxdelta);
  local_df8 = (double)_maxdelta.value;
  cVar2 = (**(code **)(CONCAT44(_maxratio.super_ValueFlagBase.super_FlagBase.super_NamedBase.
                                super_Base._vptr_Base._4_4_,
                                _maxratio.super_ValueFlagBase.super_FlagBase.super_NamedBase.
                                super_Base._vptr_Base._0_4_) + 0x10))(&_maxratio);
  local_de0 = (double)_maxratio.value;
  cVar3 = (**(code **)(CONCAT62(_alpha.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base
                                ._vptr_Base._2_6_,
                                _alpha.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base
                                ._vptr_Base._0_2_) + 0x10))();
  dVar8 = _alpha.value;
  if (cVar3 == '\0') {
    dVar8 = 1.0;
  }
  iVar4 = (*_beta.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])();
  if ((char)iVar4 != '\0') {
    local_dd8 = _beta.value;
  }
  iVar4 = (*_int0.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])();
  if ((char)iVar4 != '\0') {
    local_dd0 = (double)_int0.value;
  }
  cVar3 = (**(code **)(CONCAT44(_maxiter.super_ValueFlagBase.super_FlagBase.super_NamedBase.
                                super_Base._vptr_Base._4_4_,
                                _maxiter.super_ValueFlagBase.super_FlagBase.super_NamedBase.
                                super_Base._vptr_Base._0_4_) + 0x10))();
  if (cVar3 != '\0') {
    local_e44 = _maxiter.value;
  }
  iVar4 = (*_max_apertures.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
            [2])();
  if ((char)iVar4 != '\0') {
    local_e3c = _max_apertures.value;
  }
  std::
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&coord_files,5,(allocator_type *)&collimator);
  collimator.beam_coord._M_t._M_impl._0_4_ = 0;
  collimator.beam_coord._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = anon_var_dwarf_12fc3;
  std::pair<int,std::__cxx11::string>::operator=
            ((pair<int,std::__cxx11::string> *)
             CONCAT44(coord_files.
                      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start._4_4_,
                      coord_files.
                      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start._0_4_),
             (pair<int,_const_char_*> *)&collimator);
  collimator.beam_coord._M_t._M_impl._0_4_ = 0x46;
  collimator.beam_coord._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = anon_var_dwarf_12fdc;
  std::pair<int,std::__cxx11::string>::operator=
            ((pair<int,std::__cxx11::string> *)
             (CONCAT44(coord_files.
                       super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                       coord_files.
                       super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start._0_4_) + 0x28),
             (pair<int,_const_char_*> *)&collimator);
  collimator.beam_coord._M_t._M_impl._0_4_ = 0x8c;
  collimator.beam_coord._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = anon_var_dwarf_12ff5;
  std::pair<int,std::__cxx11::string>::operator=
            ((pair<int,std::__cxx11::string> *)
             (CONCAT44(coord_files.
                       super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                       coord_files.
                       super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start._0_4_) + 0x50),
             (pair<int,_const_char_*> *)&collimator);
  collimator.beam_coord._M_t._M_impl._0_4_ = 0xd2;
  collimator.beam_coord._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = anon_var_dwarf_1300e;
  std::pair<int,std::__cxx11::string>::operator=
            ((pair<int,std::__cxx11::string> *)
             (CONCAT44(coord_files.
                       super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                       coord_files.
                       super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start._0_4_) + 0x78),
             (pair<int,_const_char_*> *)&collimator);
  collimator.beam_coord._M_t._M_impl._0_4_ = 0x118;
  collimator.beam_coord._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = anon_var_dwarf_13019;
  std::pair<int,std::__cxx11::string>::operator=
            ((pair<int,std::__cxx11::string> *)
             (CONCAT44(coord_files.
                       super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                       coord_files.
                       super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start._0_4_) + 0xa0),
             (pair<int,_const_char_*> *)&collimator);
  organ_files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  organ_files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  organ_files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string
            ((string *)&collimator,"data/CERR_Prostate/DAO_DDM_BLADDER.dat",(allocator *)&P);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&organ_files,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&collimator);
  std::__cxx11::string::~string((string *)&collimator);
  std::__cxx11::string::string
            ((string *)&collimator,"data/CERR_Prostate/DAO_DDM_RECTUM.dat",(allocator *)&P);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&organ_files,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&collimator);
  std::__cxx11::string::~string((string *)&collimator);
  std::__cxx11::string::string
            ((string *)&collimator,"data/CERR_Prostate/DAO_DDM_PTVHD.dat",(allocator *)&P);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&organ_files,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&collimator);
  std::__cxx11::string::~string((string *)&collimator);
  imrt::Collimator::Collimator(&collimator,&coord_files);
  volumes.super__Vector_base<imrt::Volume,_std::allocator<imrt::Volume>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  volumes.super__Vector_base<imrt::Volume,_std::allocator<imrt::Volume>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  volumes.super__Vector_base<imrt::Volume,_std::allocator<imrt::Volume>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar6 = 0;
  for (uVar7 = 0;
      uVar7 < (ulong)((long)organ_files.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)organ_files.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5); uVar7 = uVar7 + 1) {
    std::__cxx11::string::string
              ((string *)&local_448,
               (string *)
               ((long)&((organ_files.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar6));
    imrt::Volume::Volume((Volume *)&P,&collimator,&local_448);
    std::vector<imrt::Volume,_std::allocator<imrt::Volume>_>::emplace_back<imrt::Volume>
              (&volumes,(Volume *)&P);
    std::
    _Rb_tree<int,_std::pair<const_int,_maths::Matrix>,_std::_Select1st<std::pair<const_int,_maths::Matrix>_>,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
    ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_maths::Matrix>,_std::_Select1st<std::pair<const_int,_maths::Matrix>_>,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
                 *)&P.angle2station);
    std::__cxx11::string::~string((string *)&local_448);
    lVar6 = lVar6 + 0x20;
  }
  std::vector<imrt::Station_*,_std::allocator<imrt::Station_*>_>::vector
            (&stations,5,(allocator_type *)&P);
  iVar4 = 0;
  for (lVar6 = 0; lVar6 != 5; lVar6 = lVar6 + 1) {
    this = (Station *)operator_new(0x170);
    imrt::Station::Station(this,&collimator,&volumes,iVar4,local_e3c,0x1c,0,2,-1,6,(fstream *)0x0);
    imrt::Station::setUniformIntensity(this,local_dd0);
    imrt::Station::printIntensity(this,false);
    *(Station **)
     (CONCAT44(stations.super__Vector_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>.
               _M_impl.super__Vector_impl_data._M_start._4_4_,
               stations.super__Vector_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>.
               _M_impl.super__Vector_impl_data._M_start._0_4_) + lVar6 * 8) = this;
    iVar4 = iVar4 + 0x46;
  }
  ev = imrt::EvaluationFunction::getInstance(&volumes,&collimator);
  P._vptr_Plan = (_func_int **)0x3ff0000000000000;
  P.angle2station._M_t._M_impl._0_8_ = 0x3ff0000000000000;
  P.angle2station._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  P.angle2station._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0x3ff00000;
  __l._M_len = 3;
  __l._M_array = (iterator)&P;
  std::vector<double,_std::allocator<double>_>::vector(&w,__l,(allocator_type *)&ils);
  P._vptr_Plan = (_func_int **)0x0;
  P.angle2station._M_t._M_impl._0_8_ = 0;
  P.angle2station._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  P.angle2station._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0x40530000;
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)&P;
  std::vector<double,_std::allocator<double>_>::vector(&Zmin,__l_00,(allocator_type *)&ils);
  P._vptr_Plan = (_func_int **)0x4050400000000000;
  P.angle2station._M_t._M_impl._0_8_ = 0x404e000000000000;
  P.angle2station._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  P.angle2station._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0x408f4000;
  __l_01._M_len = 3;
  __l_01._M_array = (iterator)&P;
  std::vector<double,_std::allocator<double>_>::vector(&Zmax,__l_01,(allocator_type *)&ils);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_a58,&w);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_a70,&Zmin);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_a88,&Zmax);
  imrt::Plan::Plan(&P,ev,(vector<double,_std::allocator<double>_> *)&local_a58,
                   (vector<double,_std::allocator<double>_> *)&local_a70,
                   (vector<double,_std::allocator<double>_> *)&local_a88);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_a88);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_a70);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_a58);
  for (lVar6 = 0; lVar6 != 5; lVar6 = lVar6 + 1) {
    imrt::Plan::add_station
              (&P,*(Station **)
                   (CONCAT44(stations.
                             super__Vector_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>.
                             _M_impl.super__Vector_impl_data._M_start._4_4_,
                             stations.
                             super__Vector_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>.
                             _M_impl.super__Vector_impl_data._M_start._0_4_) + lVar6 * 8));
  }
  ils.super_ILS.max_no_improvement = 100.0;
  ils.super_ILS.vsize = local_e40;
  ils.super_ILS.acceptance = 0;
  ils.super_ILS._vptr_ILS = (_func_int **)&PTR__ILS_00130cf0;
  ils.super_ILS._36_4_ = 1;
  ils.perturbation_size = 0;
  if (cVar1 == '\0') {
    local_df8 = 5.0;
  }
  ils.maxdelta0 = local_df8;
  if (cVar2 == '\0') {
    local_de0 = 3.0;
  }
  ils.maxratio0 = local_de0;
  ils.maxdelta = local_df8;
  ils.maxratio = local_de0;
  ils.beta = local_dd8;
  ils.super_ILS.bsize = iVar5;
  ils.alpha = dVar8;
  imrt::ILS::beamTargetedSearch(&ils.super_ILS,&P,1000,local_e44);
  system("python plotter/plot.py");
  imrt::Plan::~Plan(&P);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&Zmax.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&Zmin.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&w.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>::~_Vector_base
            (&stations.super__Vector_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>);
  std::vector<imrt::Volume,_std::allocator<imrt::Volume>_>::~vector(&volumes);
  imrt::Collimator::~Collimator(&collimator);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&organ_files);
  std::
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&coord_files);
  args::FlagBase::~FlagBase((FlagBase *)&_maxiter);
  args::FlagBase::~FlagBase((FlagBase *)&_beta);
  args::FlagBase::~FlagBase((FlagBase *)&_alpha);
  args::FlagBase::~FlagBase((FlagBase *)&_maxratio);
  args::FlagBase::~FlagBase((FlagBase *)&_maxdelta);
  args::FlagBase::~FlagBase((FlagBase *)&_max_apertures);
  args::FlagBase::~FlagBase((FlagBase *)&_int0);
  args::FlagBase::~FlagBase((FlagBase *)&_vsize);
  args::FlagBase::~FlagBase((FlagBase *)&_bsize);
  args::FlagBase::~FlagBase((FlagBase *)&help);
  args::ArgumentParser::~ArgumentParser(&parser);
  return 0;
}

Assistant:

int main(int argc, char** argv){

  int vsize=20;
  int bsize=5;
  double int0=4.0;
  int maxiter=100;
  int max_apertures=4;
  double alpha=1.0;
  double beta=1.0;
  double maxdelta=5.0;
  double maxratio=3.0;

	args::ArgumentParser parser("********* IMRT-Solver (Intensity-aperture solver) *********", "Example:\n./IAS --max_iter=400 --maxdelta=8 --maxratio=6 --alpha=0.999 --beta=0.999 --max_ap=4");
	args::HelpFlag help(parser, "help", "Display this help menu", {'h', "help"});
	//args::ValueFlag<string> _format(parser, "string", "Format: (BR, BRw, 1C)", {'f'});
	args::ValueFlag<int> _bsize(parser, "int", "Number of considered beamlets for selection ("+to_string(bsize)+")", {"bsize"});
	args::ValueFlag<int> _vsize(parser, "int", "Number of considered worst voxels ("+to_string(vsize)+")", {"vsize"});
  args::ValueFlag<int> _int0(parser, "int", "Initial intensity for beams  ("+to_string(int0)+")", {"int0"});
  args::ValueFlag<int> _max_apertures(parser, "int", "Initial intensity for the station  ("+to_string(max_apertures)+")", {"max_ap"});
  args::ValueFlag<int> _maxdelta(parser, "int", "Max delta  ("+to_string(maxdelta)+")", {"maxdelta"});
  args::ValueFlag<int> _maxratio(parser, "int", "Max ratio  ("+to_string(maxratio)+")", {"maxratio"});
  args::ValueFlag<double> _alpha(parser, "double", "Initial temperature for intensities  ("+to_string(alpha)+")", {"alpha"});
  args::ValueFlag<double> _beta(parser, "double", "Initial temperature for ratio  ("+to_string(beta)+")", {"beta"});
  args::ValueFlag<int> _maxiter(parser, "int", "Number of iterations ("+to_string(maxiter)+")", {"max_iter"});

	//args::Flag trace(parser, "trace", "Trace", {"trace"});
	//args::Positional<std::string> _file(parser, "instance", "Instance");

	try
	{
		parser.ParseCLI(argc, argv);

	}
	catch (args::Help&)
	{
		std::cout << parser;
		return 0;
	}
	catch (args::ParseError& e)
	{
		std::cerr << e.what() << std::endl;
		std::cerr << parser;
		return 1;
	}
	catch (args::ValidationError& e)
	{
		std::cerr << e.what() << std::endl;
		std::cerr << parser;
		return 1;
	}

  if(_bsize) bsize=_bsize.Get();
  if(_vsize) vsize=_vsize.Get();
  if(_maxdelta) maxdelta=_maxdelta.Get();
  if(_maxratio) maxratio=_maxratio.Get();
  if(_alpha) alpha=_alpha.Get();
  if(_beta) beta=_beta.Get();
  if(_int0) int0=_int0.Get();
  if(_maxiter) maxiter=_maxiter.Get();
  if(_max_apertures) max_apertures=_max_apertures.Get();

	vector< pair<int, string> > coord_files(5);
	coord_files[0]=(make_pair(0,"data/CERR_Prostate/CoordinatesBeam_0.txt"));
	coord_files[1]=(make_pair(70,"data/CERR_Prostate/CoordinatesBeam_70.txt"));
	coord_files[2]=(make_pair(140,"data/CERR_Prostate/CoordinatesBeam_140.txt"));
	coord_files[3]=(make_pair(210,"data/CERR_Prostate/CoordinatesBeam_210.txt"));
	coord_files[4]=(make_pair(280,"data/CERR_Prostate/CoordinatesBeam_280.txt"));

	vector<string> organ_files;
	organ_files.push_back("data/CERR_Prostate/DAO_DDM_BLADDER.dat");
	organ_files.push_back("data/CERR_Prostate/DAO_DDM_RECTUM.dat");
	organ_files.push_back("data/CERR_Prostate/DAO_DDM_PTVHD.dat");

  	Collimator collimator(coord_files);
  //	collimator.printAxisValues();
  //	collimator.printActiveBeam();

	vector<Volume> volumes;

  for (int i=0; i<organ_files.size(); i++) {
	  volumes.push_back(Volume(collimator, organ_files[i]));
	}

   //volumes[0].print_deposition();

   vector<Station*> stations(5);
   Station* station;
   for(int i=0;i<5;i++){
	   station = new Station(collimator,volumes, i*70, max_apertures);
    station->setUniformIntensity(int0);
	   station->printIntensity();
	   stations[i]=station;
   }

   EvaluationFunction& F = EvaluationFunction::getInstance(volumes,collimator);
  // Plan P(F);

	vector<double> w={1,1,1};
	vector<double> Zmin={0,0,76};
	vector<double> Zmax={65,60,1000};

	Plan P(F, w, Zmin, Zmax);
	for(int i=0;i<5;i++)
	   P.add_station(*stations[i]);

	IntensityILS ils(1, bsize, vsize, maxdelta, maxratio, alpha, beta);
	ils.beamTargetedSearch(P,1000,maxiter);


   system("python plotter/plot.py");

	return 0;

}